

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hashutil.cpp
# Opt level: O0

void __thiscall HashUtil_Sha256ByteData256_Test::TestBody(HashUtil_Sha256ByteData256_Test *this)

{
  bool bVar1;
  char *pcVar2;
  HashUtil *this_00;
  AssertHelper local_160;
  Message local_158;
  string local_150;
  undefined1 local_130 [8];
  AssertionResult gtest_ar_1;
  string local_118 [32];
  HashUtil local_f8;
  undefined1 local_d0 [8];
  ByteData byte_data2;
  Message local_b0;
  string local_a8;
  undefined1 local_88 [8];
  AssertionResult gtest_ar;
  ByteData256 byte_data;
  allocator local_49;
  string local_48;
  undefined1 local_28 [8];
  ByteData256 target;
  HashUtil_Sha256ByteData256_Test *this_local;
  
  target.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_48,"1234567890123456789012345678901234567890123456789012345678901234",
             &local_49);
  cfd::core::ByteData256::ByteData256((ByteData256 *)local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  cfd::core::HashUtil::Sha256((ByteData256 *)&gtest_ar.message_,(ByteData256 *)local_28);
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_a8,(ByteData256 *)&gtest_ar.message_);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_88,"byte_data.GetHex().c_str()",
             "\"ca1194a558362b5fa6e7887da7b41ec6faeb01c9477a0afd46dfc0692be33482\"",pcVar2,
             "ca1194a558362b5fa6e7887da7b41ec6faeb01c9477a0afd46dfc0692be33482");
  std::__cxx11::string::~string((string *)&local_a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &byte_data2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hashutil.cpp"
               ,0xbd,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &byte_data2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&local_b0);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &byte_data2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_118,"Sha256",(allocator *)((long)&gtest_ar_1.message_.ptr_ + 7));
  cfd::core::HashUtil::HashUtil(&local_f8,(string *)local_118);
  this_00 = cfd::core::HashUtil::operator<<(&local_f8,(ByteData256 *)local_28);
  cfd::core::HashUtil::Output((ByteData *)local_d0,this_00);
  cfd::core::HashUtil::~HashUtil(&local_f8);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_1.message_.ptr_ + 7));
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_150,(ByteData *)local_d0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_130,"byte_data2.GetHex().c_str()",
             "\"ca1194a558362b5fa6e7887da7b41ec6faeb01c9477a0afd46dfc0692be33482\"",pcVar2,
             "ca1194a558362b5fa6e7887da7b41ec6faeb01c9477a0afd46dfc0692be33482");
  std::__cxx11::string::~string((string *)&local_150);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_hashutil.cpp"
               ,0xc2,pcVar2);
    testing::internal::AssertHelper::operator=(&local_160,&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  cfd::core::ByteData::~ByteData((ByteData *)local_d0);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)&gtest_ar.message_);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)local_28);
  return;
}

Assistant:

TEST(HashUtil, Sha256ByteData256) {
  ByteData256 target(
      "1234567890123456789012345678901234567890123456789012345678901234");
  ByteData256 byte_data = HashUtil::Sha256(target);
  EXPECT_STREQ(
      byte_data.GetHex().c_str(),
      "ca1194a558362b5fa6e7887da7b41ec6faeb01c9477a0afd46dfc0692be33482");

  ByteData byte_data2 = (HashUtil("Sha256") << target).Output();
  EXPECT_STREQ(
      byte_data2.GetHex().c_str(),
      "ca1194a558362b5fa6e7887da7b41ec6faeb01c9477a0afd46dfc0692be33482");
}